

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_ASCIIHexDecode.hh
# Opt level: O0

shared_ptr<QPDFStreamFilter> SF_ASCIIHexDecode::factory(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFStreamFilter> *in_RDI;
  shared_ptr<QPDFStreamFilter> sVar1;
  shared_ptr<SF_ASCIIHexDecode> local_20;
  
  std::make_shared<SF_ASCIIHexDecode>();
  std::shared_ptr<QPDFStreamFilter>::shared_ptr<SF_ASCIIHexDecode,void>(in_RDI,&local_20);
  std::shared_ptr<SF_ASCIIHexDecode>::~shared_ptr(&local_20);
  sVar1.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<QPDFStreamFilter>)
         sVar1.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<QPDFStreamFilter>
    factory()
    {
        return std::make_shared<SF_ASCIIHexDecode>();
    }